

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O0

void __thiscall libtorrent::aux::tracker_list::prioritize_udp_trackers(tracker_list *this)

{
  bool bVar1;
  pointer paVar2;
  error_code *in_R8;
  undefined1 auVar3 [16];
  string_view url;
  string_view url_00;
  undefined1 local_2a0 [16];
  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
  local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  reference local_260;
  announce_entry *ae2;
  announce_entry *ae1;
  tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
  local_248 [40];
  undefined1 local_220 [16];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  undefined1 local_188 [8];
  string hostname;
  undefined1 local_148 [8];
  iterator j;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined1 local_80 [8];
  string udp_hostname;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  iterator end;
  iterator i;
  tracker_list *this_local;
  
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  ::begin((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
           *)&end);
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  ::end((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
         *)local_20);
  do {
    bVar1 = boost::intrusive::operator!=
                      (&end,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                             *)local_20);
    if (!bVar1) {
      return;
    }
    paVar2 = boost::intrusive::
             list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
             ::operator->(&end);
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)&paVar2->url);
    bVar1 = ::std::operator!=(&local_40,"udp://");
    ::std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) {
      boost::system::error_code::error_code((error_code *)((long)&udp_hostname.field_2 + 8));
      ::std::__cxx11::string::string((string *)local_80);
      paVar2 = boost::intrusive::
               list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
               ::operator->(&end);
      auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&paVar2->url);
      url._M_len = auVar3._8_8_;
      url._M_str = (char *)((long)&udp_hostname.field_2 + 8);
      parse_url_components_abi_cxx11_(&local_108,auVar3._0_8_,url,in_R8);
      in_R8 = (error_code *)&::std::ignore;
      ::std::
      tie<std::_Swallow_assign_const,std::_Swallow_assign_const,std::__cxx11::string,std::_Swallow_assign_const,std::_Swallow_assign_const>
                ((tuple<const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&>
                  *)&j,(_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore);
      ::std::
      tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
      ::operator=((tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
                   *)&j,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_108);
      ::std::
      tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~tuple(&local_108);
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
      ::begin((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
               *)local_148);
      while( true ) {
        bVar1 = boost::intrusive::operator!=
                          ((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                            *)local_148,&end);
        if (!bVar1) break;
        paVar2 = boost::intrusive::
                 list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                 ::operator->((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                               *)local_148);
        ::std::__cxx11::string::substr((ulong)((long)&hostname.field_2 + 8),(ulong)&paVar2->url);
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&hostname.field_2 + 8),"udp://");
        ::std::__cxx11::string::~string((string *)(hostname.field_2._M_local_buf + 8));
        if (!bVar1) {
          ::std::__cxx11::string::string((string *)local_188);
          paVar2 = boost::intrusive::
                   list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                   ::operator->((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                 *)local_148);
          auVar3 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&paVar2->url);
          url_00._M_len = auVar3._8_8_;
          url_00._M_str = (char *)((long)&udp_hostname.field_2 + 8);
          local_220 = auVar3;
          parse_url_components_abi_cxx11_(&local_210,auVar3._0_8_,url_00,in_R8);
          in_R8 = (error_code *)&::std::ignore;
          ::std::
          tie<std::_Swallow_assign_const,std::_Swallow_assign_const,std::__cxx11::string,std::_Swallow_assign_const,std::_Swallow_assign_const>
                    ((tuple<const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::_Swallow_assign_&,_const_std::_Swallow_assign_&>
                      *)local_248,(_Swallow_assign *)&::std::ignore,
                     (_Swallow_assign *)&::std::ignore,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                     (_Swallow_assign *)&::std::ignore,(_Swallow_assign *)&::std::ignore);
          ::std::
          tuple<std::_Swallow_assign_const&,std::_Swallow_assign_const&,std::__cxx11::string&,std::_Swallow_assign_const&,std::_Swallow_assign_const&>
          ::operator=(local_248,
                      (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_210);
          ::std::
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~tuple(&local_210);
          bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_188,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_80);
          if (bVar1) {
            ae1._4_4_ = 9;
          }
          else {
            ae2 = boost::intrusive::
                  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                  ::operator*(&end);
            local_260 = boost::intrusive::
                        list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                        ::operator*((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                     *)local_148);
            boost::intrusive::
            list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
            ::list_iterator((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
                             *)(local_278 + 8),&end);
            boost::intrusive::
            list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
            ::erase((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                     *)&stack0xfffffffffffffd98,(const_iterator *)&this->m_trackers);
            boost::intrusive::
            list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
            ::operator=(&end,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                              *)&stack0xfffffffffffffd98);
            boost::intrusive::
            list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
            ::list_iterator((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
                             *)local_278,(nonconst_iterator *)local_148);
            boost::intrusive::
            list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
            ::insert((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                      *)(local_288 + 8),(const_iterator *)&this->m_trackers,(reference)local_278);
            boost::intrusive::
            list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
            ::list_iterator(&local_290,(nonconst_iterator *)local_148);
            boost::intrusive::
            list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
            ::erase((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                     *)local_288,(const_iterator *)&this->m_trackers);
            boost::intrusive::
            list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
            ::operator=((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                         *)local_148,
                        (list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                         *)local_288);
            boost::intrusive::
            list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
            ::list_iterator((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_true>
                             *)(local_2a0 + 8),&end);
            boost::intrusive::
            list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
            ::insert((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                      *)local_2a0,(const_iterator *)&this->m_trackers,(reference)(local_2a0 + 8));
            ae1._4_4_ = 7;
          }
          ::std::__cxx11::string::~string((string *)local_188);
          if (ae1._4_4_ == 7) break;
        }
        boost::intrusive::
        list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
        ::operator++((list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                      *)local_148);
      }
      ::std::__cxx11::string::~string((string *)local_80);
    }
    boost::intrusive::
    list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
    ::operator++(&end);
  } while( true );
}

Assistant:

void tracker_list::prioritize_udp_trackers()
{
	INVARIANT_CHECK;

	// look for udp-trackers
	for (auto i = m_trackers.begin(), end(m_trackers.end()); i != end; ++i)
	{
		if (i->url.substr(0, 6) != "udp://") continue;
		// now, look for trackers with the same hostname
		// that is has higher priority than this one
		// if we find one, swap with the udp-tracker
		error_code ec;
		std::string udp_hostname;
		using std::ignore;
		std::tie(ignore, ignore, udp_hostname, ignore, ignore)
			= parse_url_components(i->url, ec);
		for (auto j = m_trackers.begin(); j != i; ++j)
		{
			if (j->url.substr(0, 6) == "udp://") continue;
			std::string hostname;
			std::tie(ignore, ignore, hostname, ignore, ignore)
				= parse_url_components(j->url, ec);
			if (hostname != udp_hostname) continue;
			auto* ae1 = &*i;
			auto* ae2 = &*j;
			i = m_trackers.erase(i);
			m_trackers.insert(j, *ae1);
			j = m_trackers.erase(j);
			m_trackers.insert(i, *ae2);
			break;
		}
	}
}